

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O2

void reg_alloc(gen_ctx_t gen_ctx)

{
  uint32_t *puVar1;
  lr_gap_t *plVar2;
  uchar uVar3;
  uint uVar4;
  lr_ctx *plVar5;
  VARR_live_range_t *pVVar6;
  lr_bb_t plVar7;
  MIR_func_t func;
  const_bitmap_t bm;
  VARR_allocno_info_t *pVVar8;
  VARR_lr_gap_t *pVVar9;
  lr_gap_t *plVar10;
  MIR_insn_t pMVar11;
  anon_union_8_2_0ec0d2a8_for_u aVar12;
  edge_t_conflict peVar13;
  bb_insn_t_conflict bb_insn;
  MIR_insn_t_conflict after;
  MIR_context_t pMVar14;
  double dVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  undefined1 uVar19;
  int iVar20;
  int iVar21;
  MIR_type_t MVar22;
  MIR_reg_t MVar23;
  int iVar24;
  MIR_reg_t MVar25;
  uint uVar26;
  size_t sVar27;
  live_range_t_conflict *__ptr;
  bb_t_conflict *__base;
  bb_t_conflict pbVar28;
  bb_t_conflict bb;
  bb_t_conflict pbVar29;
  live_range_t plVar30;
  lr_bb_t_conflict plVar31;
  reg_info_t *prVar32;
  allocno_info_t *__ptr_00;
  size_t sVar33;
  bitmap_t pVVar34;
  bitmap_t *ppVVar35;
  bitmap_t *ppVVar36;
  live_range_t_conflict plVar37;
  ra_ctx *prVar38;
  char *pcVar39;
  live_range_t_conflict plVar40;
  bitmap_t pVVar41;
  spill_cache_el_t *__ptr_01;
  bb_t pbVar42;
  spill_el_t *psVar43;
  spill_el_t *psVar44;
  DLIST_out_edge_t *pDVar45;
  MIR_insn_t pMVar46;
  MIR_insn_t_conflict pMVar47;
  bb_t_conflict pbVar48;
  bb_t_conflict pbVar49;
  uint uVar50;
  out_edge_t peVar51;
  in_edge_t peVar52;
  FILE *pFVar53;
  MIR_insn_t *ppMVar54;
  int i;
  int iVar55;
  uint uVar56;
  MIR_reg_t MVar57;
  uint uVar58;
  long lVar59;
  DLIST_bb_t *pDVar60;
  ulong uVar61;
  VARR_spill_cache_el_t *pVVar62;
  bb_insn_t pbVar63;
  anon_union_8_2_0ec0d2a8_for_u *paVar64;
  ulong uVar65;
  gen_ctx_t pgVar66;
  in_edge_t_conflict elem;
  bb_t_conflict in_RSI;
  MIR_module_t_conflict module;
  bitmap_t pVVar67;
  bb_insn_t_conflict bb_insn_00;
  char *pcVar68;
  live_range_t_conflict in_R8;
  spill_el_t *psVar69;
  in_edge_t_conflict peVar70;
  live_range_t_conflict plVar71;
  ulong uVar72;
  out_edge_t peVar73;
  long lVar74;
  long lVar75;
  bool bVar76;
  bool bVar77;
  undefined1 auVar78 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar79 [16];
  undefined1 in_ZMM2 [64];
  allocno_info_t aVar80;
  lr_gap_t obj;
  lr_gap_t obj_00;
  lr_gap_t obj_01;
  lr_gap_t el;
  lr_gap_t el_00;
  spill_el_t obj_02;
  spill_el_t obj_03;
  ulong in_stack_fffffffffffffe38;
  undefined1 auVar81 [8];
  undefined8 uVar82;
  undefined8 uVar83;
  const_bitmap_t local_180;
  long local_160;
  uint local_114;
  int local_110;
  uint local_10c;
  undefined1 local_e8 [8];
  live_range_t_conflict plStack_e0;
  bitmap_t pVStack_d8;
  live_range_t plStack_d0;
  undefined8 uStack_c8;
  undefined8 uStack_c0;
  size_t p;
  MIR_insn_t pMStack_b0;
  MIR_insn_t pMStack_a8;
  live_range_t plStack_a0;
  undefined8 uStack_98;
  MIR_disp_t MStack_90;
  live_range_t_conflict local_80;
  size_t local_78;
  ulong local_70;
  MIR_context_t local_68;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  bitmap_t *local_48;
  bitmap_t *local_40;
  size_t nel;
  
  plVar5 = gen_ctx->lr_ctx;
  uVar26 = gen_ctx->optimize_level;
  uVar61 = (ulong)gen_ctx->curr_cfg->max_var;
  plVar5->curr_point = 0;
  sVar27 = VARR_live_range_tlength(plVar5->var_live_ranges);
  if (sVar27 != 0) {
    __assert_fail("(VARR_live_range_tlength (gen_ctx->lr_ctx->var_live_ranges)) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                  ,0x1980,"void build_live_ranges(gen_ctx_t)");
  }
  lVar59 = uVar61 + 1;
  while (bVar76 = lVar59 != 0, lVar59 = lVar59 + -1, bVar76) {
    pVVar6 = gen_ctx->lr_ctx->var_live_ranges;
    __ptr = pVVar6->varr;
    if (__ptr == (live_range_t_conflict *)0x0) {
      pcVar68 = "expand";
      goto LAB_00136509;
    }
    sVar27 = pVVar6->els_num;
    uVar65 = sVar27 + 1;
    if (pVVar6->size < uVar65) {
      sVar27 = (uVar65 >> 1) + uVar65;
      in_RSI = (bb_t_conflict)(sVar27 * 8);
      __ptr = (live_range_t_conflict *)realloc(__ptr,(size_t)in_RSI);
      pVVar6->varr = __ptr;
      pVVar6->size = sVar27;
      sVar27 = pVVar6->els_num;
      uVar65 = sVar27 + 1;
    }
    pVVar6->els_num = uVar65;
    __ptr[sVar27] = (live_range_t_conflict)0x0;
  }
  local_60 = uVar61;
  if (gen_ctx->optimize_level == 0) {
    pbVar48 = (bb_t_conflict)(((gen_ctx->curr_func_item->u).func)->insns).head;
    pbVar28 = pbVar48;
    while (pbVar49 = pbVar28, pbVar49 != (bb_t_conflict)0x0) {
      pbVar28 = (bb_t_conflict)pbVar49->rpost;
      bb = get_insn_bb(gen_ctx,(MIR_insn_t)pbVar48);
      if ((pbVar28 == (bb_t_conflict)0x0) ||
         (in_RSI = pbVar28, pbVar29 = get_insn_bb(gen_ctx,(MIR_insn_t)pbVar28), bb != pbVar29)) {
        process_bb_ranges(gen_ctx,bb,(MIR_insn_t)pbVar48,(MIR_insn_t)pbVar49);
        pbVar48 = pbVar28;
        in_RSI = bb;
      }
    }
  }
  else {
    VARR_bb_ttrunc(gen_ctx->data_flow_ctx->worklist,(size_t)in_RSI);
    pDVar60 = &gen_ctx->curr_cfg->bbs;
    while (pbVar48 = pDVar60->head, pbVar48 != (bb_t_conflict)0x0) {
      in_RSI = pbVar48;
      VARR_bb_tpush(gen_ctx->data_flow_ctx->worklist,pbVar48);
      pDVar60 = (DLIST_bb_t *)&(pbVar48->bb_link).next;
    }
    if (gen_ctx->optimize_level < 2) {
      __base = VARR_bb_taddr(gen_ctx->data_flow_ctx->worklist);
      in_RSI = (bb_t_conflict)VARR_bb_tlength(gen_ctx->data_flow_ctx->worklist);
      qsort(__base,(size_t)in_RSI,8,post_cmp);
    }
    for (pbVar48 = (bb_t_conflict)0x0;
        pbVar28 = (bb_t_conflict)VARR_bb_tlength(gen_ctx->data_flow_ctx->worklist),
        pbVar48 < pbVar28; pbVar48 = (bb_t_conflict)((long)&pbVar48->index + 1)) {
      in_RSI = pbVar48;
      pbVar28 = VARR_bb_tget(gen_ctx->data_flow_ctx->worklist,(size_t)pbVar48);
      pbVar63 = (pbVar28->bb_insns).head;
      if (pbVar63 != (bb_insn_t)0x0) {
        process_bb_ranges(gen_ctx,pbVar28,pbVar63->insn,((pbVar28->bb_insns).tail)->insn);
        in_RSI = pbVar28;
      }
    }
  }
  if ((gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
    print_all_live_ranges(gen_ctx);
  }
  bitmap_clear(gen_ctx->lr_ctx->points_with_born_vars);
  bitmap_clear(gen_ctx->lr_ctx->points_with_dead_vars);
  pbVar48 = (bb_t_conflict)0x0;
  while( true ) {
    pbVar28 = (bb_t_conflict)VARR_live_range_tlength(gen_ctx->lr_ctx->var_live_ranges);
    if (pbVar28 <= pbVar48) break;
    in_RSI = pbVar48;
    for (plVar30 = VARR_live_range_tget(gen_ctx->lr_ctx->var_live_ranges,(size_t)pbVar48);
        plVar30 != (live_range_t_conflict)0x0; plVar30 = plVar30->next) {
      if (plVar30->finish < plVar30->start) {
        __assert_fail("lr->start <= lr->finish",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                      ,0x18db,"void shrink_live_ranges(gen_ctx_t)");
      }
      bitmap_set_bit_p(gen_ctx->lr_ctx->points_with_born_vars,(long)plVar30->start);
      in_RSI = (bb_t_conflict)(long)plVar30->finish;
      bitmap_set_bit_p(gen_ctx->lr_ctx->points_with_dead_vars,(size_t)in_RSI);
    }
    pbVar48 = (bb_t_conflict)((long)&pbVar48->index + 1);
  }
  VARR_inttrunc(gen_ctx->lr_ctx->point_map,(size_t)in_RSI);
  for (iVar55 = 0; plVar5 = gen_ctx->lr_ctx, iVar55 <= plVar5->curr_point; iVar55 = iVar55 + 1) {
    VARR_intpush(plVar5->point_map,0);
  }
  bitmap_ior(plVar5->points_with_born_or_dead_vars,plVar5->points_with_born_vars,
             plVar5->points_with_dead_vars);
  local_e8 = (undefined1  [8])gen_ctx->lr_ctx->points_with_born_or_dead_vars;
  plStack_e0 = (live_range_t_conflict)0x0;
  local_160 = -1;
  iVar55 = 1;
  while (iVar20 = bitmap_iterator_next((bitmap_iterator_t *)local_e8,&p), sVar27 = p, iVar20 != 0) {
    iVar20 = bitmap_bit_p(gen_ctx->lr_ctx->points_with_born_vars,p);
    iVar21 = bitmap_bit_p(gen_ctx->lr_ctx->points_with_dead_vars,sVar27);
    if (iVar20 == 0 && iVar21 == 0) {
      __assert_fail("born_p || dead_p",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                    ,0x18e9,"void shrink_live_ranges(gen_ctx_t)");
    }
    local_160 = local_160 + (ulong)(iVar55 != 0 && iVar20 != 0);
    VARR_intset(gen_ctx->lr_ctx->point_map,sVar27,(int)local_160);
    iVar55 = iVar21;
  }
  lVar75 = 0;
  lVar59 = 0;
  for (uVar61 = 0; sVar27 = VARR_live_range_tlength(gen_ctx->lr_ctx->var_live_ranges),
      uVar61 < sVar27; uVar61 = uVar61 + 1) {
    plVar30 = VARR_live_range_tget(gen_ctx->lr_ctx->var_live_ranges,uVar61);
    plVar40 = (live_range_t_conflict)0x0;
    while (plVar37 = plVar30, plVar37 != (live_range_t_conflict)0x0) {
      plVar30 = plVar37->next;
      lVar75 = lVar75 + 1;
      iVar55 = VARR_intget(gen_ctx->lr_ctx->point_map,(long)plVar37->start);
      plVar37->start = iVar55;
      iVar55 = VARR_intget(gen_ctx->lr_ctx->point_map,(long)plVar37->finish);
      plVar37->finish = iVar55;
      if ((plVar40 == (live_range_t_conflict)0x0) ||
         ((plVar40->start != iVar55 && (plVar40->start != iVar55 + 1)))) {
LAB_00133c20:
        lVar59 = lVar59 + 1;
        plVar40 = plVar37;
      }
      else {
        plVar31 = plVar37->lr_bb;
        if (plVar40->lr_bb == (lr_bb_t_conflict)0x0) {
          if (plVar31 != (lr_bb_t_conflict)0x0) goto LAB_00133c20;
          plVar31 = (lr_bb_t_conflict)0x0;
        }
        else if (plVar31 == (lr_bb_t_conflict)0x0) goto LAB_00133c20;
        plVar40->start = plVar37->start;
        plVar40->next = plVar30;
        while (plVar31 != (lr_bb_t_conflict)0x0) {
          plVar7 = plVar31->next;
          plVar31->next = plVar40->lr_bb;
          plVar40->lr_bb = plVar31;
          plVar37->lr_bb = plVar7;
          plVar31 = plVar7;
        }
        free_one_live_range(gen_ctx,plVar37);
      }
    }
  }
  local_160 = local_160 + 1;
  if (((FILE *)gen_ctx->debug_file == (FILE *)0x0) || (gen_ctx->debug_level < 2)) {
    gen_ctx->lr_ctx->curr_point = (int)local_160;
  }
  else {
    uVar50 = gen_ctx->lr_ctx->curr_point;
    if ((long)(int)uVar50 == 0) {
      in_R8 = (live_range_t_conflict)0x64;
    }
    else {
      in_R8 = (live_range_t_conflict)((local_160 * 100) / (long)(int)uVar50);
    }
    fprintf((FILE *)gen_ctx->debug_file,"Compressing live range points: from %d to %ld - %ld%%\n",
            (ulong)uVar50,local_160);
    pFVar53 = (FILE *)gen_ctx->debug_file;
    if (lVar59 != lVar75) {
      if (lVar59 == 0) {
        in_R8 = (live_range_t_conflict)0x64;
      }
      else {
        in_R8 = (live_range_t_conflict)((lVar59 * 100) / lVar75);
      }
      fprintf(pFVar53,"Compressing live ranges: from %ld to %ld - %ld%%\n",lVar75,lVar59);
      pFVar53 = (FILE *)gen_ctx->debug_file;
    }
    gen_ctx->lr_ctx->curr_point = (int)local_160;
    if ((pFVar53 != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
      fwrite("Ranges after the compression:\n",0x1e,1,pFVar53);
      print_all_live_ranges(gen_ctx);
    }
  }
  local_68 = gen_ctx->ctx;
  module = gen_ctx->curr_func_item->module;
  uVar50 = gen_ctx->curr_cfg->max_var;
  func = (gen_ctx->curr_func_item->u).func;
  local_180 = (const_bitmap_t)_MIR_get_module_global_var_hard_regs(local_68,module);
  uVar4 = gen_ctx->optimize_level;
  pVVar41 = gen_ctx->ra_ctx->conflict_locs1;
  bm = gen_ctx->temp_bitmap2;
  gen_ctx->func_stack_slots_num = 0;
  prVar32 = VARR_reg_info_taddr(gen_ctx->curr_cfg->reg_info);
  prVar38 = gen_ctx->ra_ctx;
  prVar38->curr_reg_infos = prVar32;
  VARR_MIR_reg_ttrunc(prVar38->reg_renumber,(size_t)module);
  for (uVar56 = 0; uVar56 <= uVar50; uVar56 = uVar56 + 1) {
    VARR_MIR_reg_tpush(gen_ctx->ra_ctx->reg_renumber,0xffffffff);
  }
  prVar38 = gen_ctx->ra_ctx;
  pVVar8 = prVar38->sorted_regs;
  if ((pVVar8 == (VARR_allocno_info_t *)0x0) || (pVVar8->varr == (allocno_info_t *)0x0)) {
    pcVar68 = "trunc";
  }
  else {
    pVVar8->els_num = 0;
    prVar32 = prVar38->curr_reg_infos;
    prVar38->start_mem_loc = 0x22;
    for (uVar56 = 0x22; uVar56 <= uVar50; uVar56 = uVar56 + 1) {
      uVar61 = (ulong)uVar56;
      iVar55 = bitmap_bit_p(gen_ctx->tied_regs,uVar61);
      iVar20 = bitmap_bit_p(gen_ctx->addr_regs,uVar61);
      if (iVar20 == 0) {
        pVVar8 = gen_ctx->ra_ctx->sorted_regs;
        __ptr_00 = pVVar8->varr;
        if (__ptr_00 == (allocno_info_t *)0x0) {
          pcVar68 = "expand";
          goto LAB_001365b4;
        }
        sVar27 = pVVar8->els_num;
        uVar65 = sVar27 + 1;
        if (pVVar8->size < uVar65) {
          sVar27 = (uVar65 >> 1) + uVar65;
          __ptr_00 = (allocno_info_t *)realloc(__ptr_00,sVar27 * 0x10);
          pVVar8->varr = __ptr_00;
          pVVar8->size = sVar27;
          sVar27 = pVVar8->els_num;
          uVar65 = sVar27 + 1;
        }
        pVVar8->els_num = uVar65;
        __ptr_00[sVar27].reg = uVar56;
        __ptr_00[sVar27].tied_reg_p = iVar55;
        __ptr_00[sVar27].reg_infos = prVar32;
        plVar30 = VARR_live_range_tget(gen_ctx->lr_ctx->var_live_ranges,uVar61);
        sVar27 = 0;
        for (; plVar30 != (live_range_t_conflict)0x0; plVar30 = plVar30->next) {
          sVar27 = sVar27 + (long)((plVar30->finish - plVar30->start) + 1);
        }
        gen_ctx->ra_ctx->curr_reg_infos[uVar61].live_length = sVar27;
      }
      else {
        MVar22 = MIR_reg_type(gen_ctx->ctx,uVar56 - 0x21,func);
        MVar23 = get_new_stack_slot(gen_ctx,MVar22,(int *)&p);
        VARR_MIR_reg_tset(gen_ctx->ra_ctx->reg_renumber,uVar61,MVar23);
        gen_ctx->ra_ctx->start_mem_loc = (int)p + MVar23;
        pFVar53 = (FILE *)gen_ctx->debug_file;
        if ((pFVar53 != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
          pcVar68 = MIR_reg_name(gen_ctx->ctx,uVar56 - 0x21,func);
          in_R8 = (live_range_t_conflict)gen_ctx->ra_ctx->curr_reg_infos[uVar61].freq;
          fprintf(pFVar53," Assigning to addressable %s:reg=%3u (freq %-3ld) -- %lu\n",pcVar68,
                  (ulong)uVar56);
        }
      }
    }
    for (sVar27 = 0;
        ((long)sVar27 <= (long)gen_ctx->lr_ctx->curr_point &&
        (sVar33 = VARR_bitmap_tlength(gen_ctx->ra_ctx->used_locs), (long)sVar27 < (long)(int)sVar33)
        ); sVar27 = sVar27 + 1) {
      pVVar34 = VARR_bitmap_tget(gen_ctx->ra_ctx->used_locs,sVar27);
      if (local_180 == (const_bitmap_t)0x0) {
        bitmap_clear(pVVar34);
        if (1 < uVar4) {
          pVVar34 = VARR_bitmap_tget(gen_ctx->ra_ctx->busy_used_locs,sVar27);
          bitmap_clear(pVVar34);
        }
      }
      else {
        bitmap_copy(pVVar34,local_180);
        if (1 < uVar4) {
          pVVar34 = VARR_bitmap_tget(gen_ctx->ra_ctx->busy_used_locs,sVar27);
          bitmap_copy(pVVar34,local_180);
        }
      }
    }
    while (sVar27 = VARR_bitmap_tlength(gen_ctx->ra_ctx->used_locs),
          (int)sVar27 <= gen_ctx->lr_ctx->curr_point) {
      pVVar34 = bitmap_create2(0x22);
      if (local_180 != (const_bitmap_t)0x0) {
        bitmap_copy(pVVar34,local_180);
      }
      VARR_bitmap_tpush(gen_ctx->ra_ctx->used_locs,pVVar34);
      if (1 < uVar4) {
        pVVar34 = bitmap_create2(0x22);
        if (local_180 != (const_bitmap_t)0x0) {
          bitmap_copy(pVVar34,local_180);
        }
        VARR_bitmap_tpush(gen_ctx->ra_ctx->busy_used_locs,pVVar34);
      }
    }
    pVVar8 = gen_ctx->ra_ctx->sorted_regs;
    if (pVVar8 != (VARR_allocno_info_t *)0x0) {
      uVar50 = (uint)pVVar8->els_num;
      qsort(pVVar8->varr,(long)(int)uVar50,0x10,allocno_info_compare_func);
      ppVVar35 = VARR_bitmap_taddr(gen_ctx->ra_ctx->used_locs);
      ppVVar36 = VARR_bitmap_taddr(gen_ctx->ra_ctx->busy_used_locs);
      for (sVar27 = 0; sVar27 != 0x22; sVar27 = sVar27 + 1) {
        for (plVar30 = VARR_live_range_tget(gen_ctx->lr_ctx->var_live_ranges,sVar27);
            plVar30 != (live_range_t_conflict)0x0; plVar30 = plVar30->next) {
          for (lVar59 = (long)plVar30->start; lVar59 <= plVar30->finish; lVar59 = lVar59 + 1) {
            bitmap_set_bit_p(ppVVar35[lVar59],sVar27);
            if (1 < uVar4) {
              bitmap_set_bit_p(ppVVar36[lVar59],sVar27);
            }
          }
        }
      }
      bitmap_clear(gen_ctx->func_used_hard_regs);
      if (1 < uVar4) {
        HTAB_lr_gap_t_clear(gen_ctx->ra_ctx->lr_gap_tab);
      }
      local_50 = (ulong)(~((int)uVar50 >> 0x1f) & uVar50);
      sVar27 = 0;
      while (sVar27 != local_50) {
        local_78 = sVar27;
        aVar80 = VARR_allocno_info_tget(gen_ctx->ra_ctx->sorted_regs,sVar27);
        plVar40 = aVar80._0_8_;
        uVar50 = aVar80.reg;
        pVVar34 = (bitmap_t)(ulong)uVar50;
        MVar23 = VARR_MIR_reg_tget(gen_ctx->ra_ctx->reg_renumber,(size_t)pVVar34);
        if (MVar23 == 0xffffffff) {
          MVar23 = uVar50 - 0x21;
          MVar22 = MIR_reg_type(gen_ctx->ctx,MVar23,func);
          aVar80 = VARR_allocno_info_tget(gen_ctx->ra_ctx->sorted_regs,local_78);
          pMVar14 = local_68;
          if (aVar80._0_8_ >> 0x20 == 0) {
            pVVar67 = pVVar34;
            plVar37 = VARR_live_range_tget(gen_ctx->lr_ctx->var_live_ranges,(size_t)pVVar34);
            if (plVar37 != (live_range_t_conflict)0x0) {
              bitmap_clear(pVVar41);
              for (plVar30 = plVar37; plVar30 != (live_range_t_conflict)0x0; plVar30 = plVar30->next
                  ) {
                for (lVar59 = (long)plVar30->start; lVar59 <= plVar30->finish; lVar59 = lVar59 + 1)
                {
                  pVVar67 = pVVar41;
                  bitmap_ior(pVVar41,pVVar41,ppVVar35[lVar59]);
                }
              }
              VARR_lr_gap_ttrunc(gen_ctx->ra_ctx->spill_gaps,(size_t)pVVar67);
              uVar56 = 0;
              MVar25 = 0xffffffff;
              for (sVar27 = 0; sVar27 != 0x22; sVar27 = sVar27 + 1) {
                iVar55 = bitmap_bit_p(pVVar41,sVar27);
                if (iVar55 == 0) {
                  MVar57 = (MIR_reg_t)sVar27;
                  iVar55 = target_hard_reg_type_ok_p(MVar57,MVar22);
                  if ((iVar55 != 0) && (iVar55 = target_fixed_hard_reg_p(MVar57), iVar55 == 0)) {
                    if (MVar25 == 0xffffffff) {
LAB_001343fd:
                      uVar56 = bitmap_bit_p(gen_ctx->call_used_hard_regs[0x12],sVar27);
                      uVar56 = uVar56 ^ 1;
                      MVar25 = MVar57;
                    }
                    else if (uVar56 == 0) {
                      uVar56 = 0;
                    }
                    else {
                      iVar55 = bitmap_bit_p(gen_ctx->call_used_hard_regs[0x12],sVar27);
                      uVar56 = 1;
                      if (iVar55 != 0) goto LAB_001343fd;
                    }
                  }
                }
              }
              if (MVar25 == 0xffffffff) {
                prVar38 = gen_ctx->ra_ctx;
                if (uVar4 < 2) {
LAB_001348b9:
                  in_R8 = (live_range_t_conflict)&p;
                  MVar25 = get_stack_loc(gen_ctx,prVar38->start_mem_loc,MVar22,pVVar41,(int *)in_R8)
                  ;
                  goto LAB_001348db;
                }
                local_40 = VARR_bitmap_taddr(prVar38->used_locs);
                local_48 = VARR_bitmap_taddr(gen_ctx->ra_ctx->busy_used_locs);
                uVar56 = 0;
                local_114 = 0;
                local_70 = CONCAT44(uVar50,MVar22 << 0x10);
                iVar55 = 0;
                MVar25 = 0xffffffff;
                local_80 = plVar37;
                for (uVar61 = 0; plVar37 = local_80, uVar61 != 0x22; uVar61 = uVar61 + 1) {
                  MVar57 = (MIR_reg_t)uVar61;
                  uVar65 = (ulong)MVar22;
                  iVar20 = target_hard_reg_type_ok_p(MVar57,MVar22);
                  if ((iVar20 == 0) || (iVar20 = target_fixed_hard_reg_p(MVar57), iVar20 != 0)) {
                    in_R8 = (live_range_t_conflict)(ulong)uVar56;
                  }
                  else {
                    VARR_lr_gap_ttrunc(gen_ctx->ra_ctx->curr_gaps,uVar65);
                    local_10c = 0;
                    local_110 = (int)gen_ctx->ra_ctx->curr_reg_infos[(long)pVVar34].freq;
                    local_58 = uVar61 | local_70;
                    for (plVar30 = local_80; plVar30 != (live_range_t_conflict)0x0;
                        plVar30 = plVar30->next) {
                      iVar20 = available_hreg_p(MVar57,1,(int)local_40,(bitmap_t *)plVar30,in_R8);
                      if (iVar20 == 0) {
                        iVar20 = available_hreg_p(MVar57,1,(int)local_48,(bitmap_t *)plVar30,in_R8);
                        if (iVar20 == 0) {
                          if (plVar30->lr_bb == (lr_bb_t_conflict)0x0) goto LAB_00134882;
                          uVar58 = gap_lr_spill_cost(gen_ctx,plVar30);
                          local_110 = local_110 - uVar58;
                          local_180 = (const_bitmap_t)(ulong)uVar58;
                          obj_01.lr = plVar30;
                          obj_01.hreg = (undefined2)local_58;
                          obj_01.type = local_58._2_2_;
                          obj_01.reg = local_58._4_4_;
                          VARR_lr_gap_tpush(gen_ctx->ra_ctx->curr_gaps,obj_01);
                        }
                        else {
                          pVVar9 = gen_ctx->ra_ctx->curr_gaps;
                          for (iVar20 = 0; iVar20 != 1; iVar20 = iVar20 + 1) {
                            sVar27 = VARR_lr_gap_tlength(pVVar9);
                            if (sVar27 == 0) {
                              plVar37 = (live_range_t_conflict)0x0;
                            }
                            else {
                              if (((pVVar9 == (VARR_lr_gap_t *)0x0) ||
                                  (pVVar9->varr == (lr_gap_t *)0x0)) || (pVVar9->els_num == 0)) {
                                pcVar68 = "last";
                                goto LAB_0013646e;
                              }
                              plVar37 = pVVar9->varr[pVVar9->els_num - 1].lr;
                            }
                            iVar21 = plVar30->start;
                            do {
                              if (iVar21 < 0) {
                                iVar21 = plVar30->start;
                                local_180 = (const_bitmap_t)0x0;
                                goto LAB_001346d3;
                              }
                              iVar24 = find_lr_gap(gen_ctx,iVar20 + MVar57,iVar21,
                                                   (lr_gap_t *)local_e8);
                              plVar71 = plStack_e0;
                              iVar21 = iVar21 + -1;
                            } while (iVar24 == 0);
                            iVar21 = plVar30->start;
                            local_180 = (const_bitmap_t)0x0;
                            iVar24 = plStack_e0->finish;
                            if ((iVar21 <= iVar24) && (iVar21 = iVar24, plVar37 != plStack_e0)) {
                              obj.lr = plStack_e0;
                              obj.hreg = local_e8._0_2_;
                              obj.type = local_e8._2_2_;
                              obj.reg = local_e8._4_4_;
                              VARR_lr_gap_tpush(pVVar9,obj);
                              uVar58 = gap_lr_spill_cost(gen_ctx,plVar71);
                              local_180 = (const_bitmap_t)(ulong)uVar58;
                              plVar37 = plVar71;
                            }
LAB_001346d3:
                            while (iVar21 < plVar30->finish) {
                              iVar24 = find_lr_gap(gen_ctx,iVar20 + MVar57,iVar21 + 1,
                                                   (lr_gap_t *)local_e8);
                              plVar71 = plStack_e0;
                              iVar21 = iVar21 + 1;
                              if (iVar24 != 0) {
                                if (plVar37 != plStack_e0) {
                                  obj_00.lr = plStack_e0;
                                  obj_00.hreg = local_e8._0_2_;
                                  obj_00.type = local_e8._2_2_;
                                  obj_00.reg = local_e8._4_4_;
                                  VARR_lr_gap_tpush(pVVar9,obj_00);
                                  iVar21 = gap_lr_spill_cost(gen_ctx,plVar71);
                                  local_180 = (const_bitmap_t)(ulong)((uint)local_180 + iVar21);
                                  plVar37 = plVar71;
                                }
                                iVar21 = plVar71->finish;
                              }
                            }
                          }
                          local_110 = local_110 - (uint)local_180;
                          local_10c = ((local_10c + plVar30->finish) - plVar30->start) + 1;
                        }
                      }
                    }
                    if (local_110 < 0) {
                      in_R8 = (live_range_t_conflict)(ulong)uVar56;
                    }
                    else {
                      uVar58 = bitmap_bit_p(gen_ctx->call_used_hard_regs[0x12],uVar61);
                      if (((MVar25 == 0xffffffff) || (iVar55 < local_110)) ||
                         (((uVar58 != 0 && local_114 != 0) && local_110 == iVar55 ||
                          (((local_110 == iVar55 && (local_114 == (uVar58 == 0))) &&
                           ((int)uVar56 < (int)local_10c)))))) {
                        prVar38 = gen_ctx->ra_ctx;
                        local_114 = uVar58 ^ 1;
                        auVar78._0_8_ = prVar38->spill_gaps;
                        auVar78._8_8_ = prVar38->curr_gaps;
                        auVar78 = vpermilps_avx(auVar78,0x4e);
                        in_ZMM0 = ZEXT1664(auVar78);
                        prVar38->spill_gaps = (VARR_lr_gap_t *)auVar78._0_8_;
                        prVar38->curr_gaps = (VARR_lr_gap_t *)auVar78._8_8_;
                        iVar55 = local_110;
                        MVar25 = MVar57;
                        uVar56 = local_10c;
                      }
LAB_00134882:
                      in_R8 = (live_range_t_conflict)(ulong)uVar56;
                    }
                  }
                  uVar56 = (uint)in_R8;
                }
                if (MVar25 == 0xffffffff) {
                  prVar38 = gen_ctx->ra_ctx;
                  goto LAB_001348b9;
                }
                setup_used_hard_regs(gen_ctx,MVar22,MVar25);
                pcVar68 = "(with splitting live ranges)";
              }
              else {
                setup_used_hard_regs(gen_ctx,MVar22,MVar25);
LAB_001348db:
                pcVar68 = "";
              }
              pFVar53 = (FILE *)gen_ctx->debug_file;
              if ((pFVar53 != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
                pcVar39 = MIR_reg_name(gen_ctx->ctx,MVar23,func);
                in_stack_fffffffffffffe38 = (ulong)MVar25;
                in_R8 = plVar40;
                fprintf(pFVar53," Assigning %s to %s:reg=%3u (freq %-3ld) -- %lu\n",pcVar68,pcVar39,
                        plVar40,gen_ctx->ra_ctx->curr_reg_infos[(long)pVVar34].freq,
                        in_stack_fffffffffffffe38);
                fwrite("  live range: ",0xe,1,(FILE *)gen_ctx->debug_file);
                print_live_ranges(gen_ctx,plVar37);
              }
              bitmap_clear(bm);
              while( true ) {
                sVar27 = VARR_lr_gap_tlength(gen_ctx->ra_ctx->spill_gaps);
                if (sVar27 == 0) break;
                pVVar9 = gen_ctx->ra_ctx->spill_gaps;
                if (((pVVar9 == (VARR_lr_gap_t *)0x0) ||
                    (plVar10 = pVVar9->varr, plVar10 == (lr_gap_t *)0x0)) || (pVVar9->els_num == 0))
                {
                  pcVar68 = "pop";
LAB_0013646e:
                  mir_varr_assert_fail(pcVar68,"lr_gap_t");
                }
                sVar27 = pVVar9->els_num - 1;
                pVVar9->els_num = sVar27;
                plVar2 = plVar10 + sVar27;
                uVar61._0_2_ = plVar2->hreg;
                uVar61._2_2_ = plVar2->type;
                uVar61._4_4_ = plVar2->reg;
                plVar37 = plVar10[sVar27].lr;
                if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (3 < gen_ctx->debug_level)) {
                  pcVar68 = "";
                  in_R8 = (live_range_t_conflict)(ulong)(uint)(int)(short)(undefined2)uVar61;
                  if (uVar61._4_4_ == uVar50) {
                    pcVar68 = "*";
                  }
                  in_stack_fffffffffffffe38 =
                       CONCAT44((int)(in_stack_fffffffffffffe38 >> 0x20),plVar37->finish);
                  fprintf((FILE *)gen_ctx->debug_file,"   Splitting lr gap: r%d%s, h%d [%d..%d]\n",
                          uVar61 >> 0x20,pcVar68,in_R8,(ulong)(uint)plVar37->start,
                          in_stack_fffffffffffffe38);
                }
                plVar71 = plVar37;
                while (plVar31 = plVar71->lr_bb, plVar31 != (lr_bb_t_conflict)0x0) {
                  bitmap_set_bit_p(plVar31->bb->gen,uVar61 >> 0x20);
                  plVar71 = (live_range_t_conflict)&plVar31->next;
                }
                if (uVar61._4_4_ == uVar50) {
                  bitmap_set_bit_p(bm,(long)plVar37->start);
                }
                else {
                  uVar56 = (uint)(short)(undefined2)uVar61;
                  local_180 = (const_bitmap_t)(ulong)uVar56;
                  for (lVar59 = 0;
                      lVar59 != (ulong)(((uint)uVar61 & 0xffff0000) == 0xa0000 && 0x21 < uVar56) + 1
                      ; lVar59 = lVar59 + 1) {
                    if (plVar37->lr_bb == (lr_bb_t_conflict)0x0) {
LAB_00136448:
                      __assert_fail("lr->lr_bb != ((void*)0) && gen_ctx->ra_ctx->lr_gap_bitmaps[hreg] != ((void*)0)"
                                    ,
                                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                                    ,0x1c51,"void delete_lr_gap(gen_ctx_t, int, live_range_t)");
                    }
                    uVar58 = uVar56 + (int)lVar59;
                    pVVar67 = gen_ctx->ra_ctx->lr_gap_bitmaps[(int)uVar58];
                    if (pVVar67 == (bitmap_t)0x0) goto LAB_00136448;
                    bitmap_clear_bit_p(pVVar67,(long)plVar37->start);
                    el._0_4_ = uVar58 & 0xffff;
                    el.reg = 0;
                    in_R8 = (live_range_t_conflict)local_e8;
                    el.lr = plVar37;
                    HTAB_lr_gap_t_do(gen_ctx->ra_ctx->lr_gap_tab,el,HTAB_DELETE,(lr_gap_t *)in_R8);
                    for (lVar75 = (long)plVar37->start; lVar75 <= plVar37->finish;
                        lVar75 = lVar75 + 1) {
                      bitmap_clear_bit_p(ppVVar35[lVar75],(ulong)uVar58);
                    }
                  }
                }
              }
              VARR_MIR_reg_tset(gen_ctx->ra_ctx->reg_renumber,(size_t)pVVar34,MVar25);
              bVar76 = 0x21 < MVar25;
              uVar50 = (MVar22 == MIR_T_LD && bVar76) + 1;
              uVar61 = (ulong)uVar50;
              p = CONCAT44(p._4_4_,uVar50);
              plVar30 = VARR_live_range_tget(gen_ctx->lr_ctx->var_live_ranges,(size_t)pVVar34);
              for (; plVar30 != (live_range_t_conflict)0x0; plVar30 = plVar30->next) {
                if ((uVar4 < 2 || bVar76) ||
                   (iVar55 = bitmap_bit_p(bm,(long)plVar30->start), iVar55 == 0)) {
                  for (lVar59 = (long)plVar30->start; uVar65 = uVar61, uVar50 = MVar25,
                      lVar59 <= plVar30->finish; lVar59 = lVar59 + 1) {
                    while (uVar65 != 0) {
                      bitmap_set_bit_p(ppVVar35[lVar59],(ulong)uVar50);
                      uVar65 = uVar65 - 1;
                      uVar50 = uVar50 + 1;
                    }
                  }
                  if (uVar4 >= 2 && !bVar76) {
                    local_180 = (const_bitmap_t)(ulong)MVar25;
                    if (plVar30->lr_bb == (lr_bb_t_conflict)0x0) goto LAB_00134d47;
                    while (bVar77 = uVar65 != 0, uVar65 = uVar65 - 1, bVar77) {
                      if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (3 < gen_ctx->debug_level)
                         ) {
                        fprintf((FILE *)gen_ctx->debug_file,"    Adding lr gap: r%d, h%d [%d..%d]\n"
                                ,plVar40,local_180,(ulong)(uint)plVar30->start);
                      }
                      if (plVar30->lr_bb == (lr_bb_t_conflict)0x0) {
                        __assert_fail("lr->lr_bb != ((void*)0)",
                                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                                      ,0x1c49,
                                      "void insert_lr_gap(gen_ctx_t, int, MIR_type_t, MIR_reg_t, live_range_t)"
                                     );
                      }
                      lVar59 = (long)(int)(uint)local_180;
                      pVVar34 = gen_ctx->ra_ctx->lr_gap_bitmaps[lVar59];
                      iVar55 = plVar30->start;
                      if (pVVar34 == (bitmap_t)0x0) {
                        pVVar34 = bitmap_create2((long)((iVar55 * 3) / 2));
                        gen_ctx->ra_ctx->lr_gap_bitmaps[lVar59] = pVVar34;
                        pVVar34 = gen_ctx->ra_ctx->lr_gap_bitmaps[lVar59];
                        iVar55 = plVar30->start;
                      }
                      uVar72 = (ulong)((uint)local_180 & 0xffff | MVar22 << 0x10) |
                               (long)plVar40 << 0x20;
                      bitmap_set_bit_p(pVVar34,(long)iVar55);
                      in_R8 = (live_range_t_conflict)local_e8;
                      el_00.lr = plVar30;
                      el_00.hreg = (short)uVar72;
                      el_00.type = (short)(uVar72 >> 0x10);
                      el_00.reg = (int)(uVar72 >> 0x20);
                      HTAB_lr_gap_t_do(gen_ctx->ra_ctx->lr_gap_tab,el_00,HTAB_INSERT,
                                       (lr_gap_t *)in_R8);
                      local_180 = (const_bitmap_t)(ulong)((uint)local_180 + 1);
                    }
                  }
                }
                else if (plVar30->lr_bb == (lr_bb_t_conflict)0x0) {
LAB_00134d47:
                  for (lVar59 = (long)plVar30->start; uVar65 = uVar61, uVar50 = MVar25,
                      lVar59 <= plVar30->finish; lVar59 = lVar59 + 1) {
                    while (uVar65 != 0) {
                      bitmap_set_bit_p(ppVVar36[lVar59],(ulong)uVar50);
                      uVar65 = uVar65 - 1;
                      uVar50 = uVar50 + 1;
                    }
                  }
                }
              }
            }
          }
          else {
            pcVar68 = MIR_reg_hard_reg_name(local_68,MVar23,func);
            uVar50 = _MIR_get_hard_reg(pMVar14,pcVar68);
            if (0x21 < uVar50) {
              __assert_fail("hard_reg >= 0 && hard_reg <= ST1_HARD_REG && target_locs_num (hard_reg, type) == 1"
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                            ,0x1dac,"void assign(gen_ctx_t)");
            }
            VARR_MIR_reg_tset(gen_ctx->ra_ctx->reg_renumber,(size_t)pVVar34,uVar50);
            plVar30 = VARR_live_range_tget(gen_ctx->lr_ctx->var_live_ranges,(size_t)pVVar34);
            for (; plVar30 != (live_range_t_conflict)0x0; plVar30 = plVar30->next) {
              lVar59 = (long)plVar30->start;
              while (lVar59 <= plVar30->finish) {
                iVar55 = bitmap_bit_p(ppVVar35[lVar59],(ulong)uVar50);
                lVar59 = lVar59 + 1;
                if (iVar55 == 0) {
                  __assert_fail("bitmap_bit_p (used_locs_addr[j], hard_reg)",
                                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                                ,0x1db1,"void assign(gen_ctx_t)");
                }
              }
            }
            if (pcVar68 == (char *)0x0) {
              setup_used_hard_regs(gen_ctx,MVar22,uVar50);
            }
            pFVar53 = (FILE *)gen_ctx->debug_file;
            if ((pFVar53 != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
              pcVar68 = MIR_reg_name(gen_ctx->ctx,MVar23,func);
              in_R8 = (live_range_t_conflict)gen_ctx->ra_ctx->curr_reg_infos[(long)pVVar34].freq;
              fprintf(pFVar53," Assigning to global %s:reg=%3u (freq %-3ld) -- %lu\n",pcVar68,
                      plVar40);
            }
          }
        }
        sVar27 = local_78 + 1;
      }
      if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
        fwrite("+++++++++++++Disposition after assignment:",0x2a,1,(FILE *)gen_ctx->debug_file);
        uVar61 = 0x22;
        while( true ) {
          if ((uint)local_60 < (uint)uVar61) break;
          if ((uVar61 & 7) == 0) {
            fputc(10,(FILE *)gen_ctx->debug_file);
          }
          fprintf((FILE *)gen_ctx->debug_file," %3u=>",uVar61);
          sVar27 = VARR_live_range_tlength(gen_ctx->lr_ctx->var_live_ranges);
          if ((uVar61 < sVar27) &&
             (plVar40 = VARR_live_range_tget(gen_ctx->lr_ctx->var_live_ranges,uVar61),
             plVar40 != (live_range_t_conflict)0x0)) {
            pFVar53 = (FILE *)gen_ctx->debug_file;
            MVar23 = VARR_MIR_reg_tget(gen_ctx->ra_ctx->reg_renumber,uVar61);
            fprintf(pFVar53,"%-2u",(ulong)MVar23);
          }
          else {
            fwrite("UA",2,1,(FILE *)gen_ctx->debug_file);
          }
          uVar61 = (ulong)((uint)uVar61 + 1);
        }
        fputc(10,(FILE *)gen_ctx->debug_file);
      }
      MVar23 = 5 - (gen_ctx->target_ctx->keep_fp_p == '\0');
      pVVar41 = (bitmap_t)
                _MIR_get_module_global_var_hard_regs(gen_ctx->ctx,gen_ctx->curr_func_item->module);
      if (1 < gen_ctx->optimize_level) {
        prVar38 = gen_ctx->ra_ctx;
        plVar40 = (live_range_t_conflict)gen_ctx->temp_bitmap;
        pVVar34 = gen_ctx->temp_bitmap2;
        puVar1 = &prVar38->spill_cache_age;
        *puVar1 = *puVar1 + 1;
        pVVar62 = prVar38->spill_cache;
        if ((pVVar62 == (VARR_spill_cache_el_t *)0x0) || (pVVar62->varr == (spill_cache_el_t *)0x0))
        {
          pcVar68 = "trunc";
LAB_00136544:
          mir_varr_assert_fail(pcVar68,"spill_cache_el_t");
        }
        pVVar62->els_num = 0;
LAB_00134f4a:
        if (pVVar62 == (VARR_spill_cache_el_t *)0x0) {
          pcVar68 = "length";
        }
        else {
          uVar61 = pVVar62->els_num;
          if (gen_ctx->curr_cfg->max_var < uVar61) {
            pDVar60 = &gen_ctx->curr_cfg->bbs;
            lVar59 = 0;
            lVar74 = 0;
            lVar75 = 0;
            while( true ) {
              auVar79 = in_ZMM2._0_16_;
              auVar78 = in_ZMM0._0_16_;
              pbVar48 = pDVar60->head;
              if (pbVar48 == (bb_t_conflict)0x0) break;
              local_e8 = (undefined1  [8])pbVar48;
              plStack_e0 = plVar40;
              pVStack_d8 = pVVar34;
              bitmap_copy((bitmap_t)plVar40,pbVar48->out);
              bitmap_clear(pVVar34);
              pbVar63 = (pbVar48->bb_insns).tail;
              while (pbVar63 != (bb_insn_t)0x0) {
                ppMVar54 = &pbVar63->insn;
                pbVar63 = (pbVar63->bb_insn_link).prev;
                lVar74 = lVar74 + (ulong)((*(ulong *)&(*ppMVar54)->field_0x18 & 0xfffffffc) == 0);
                uVar50 = rewrite_insn(gen_ctx,*ppMVar54,MVar23,(rewrite_data *)local_e8);
                lVar59 = lVar59 + (ulong)uVar50;
                lVar75 = lVar75 + 1;
              }
              iVar55 = bitmap_equal_p((const_bitmap_t)plVar40,pbVar48->in);
              if (iVar55 == 0) {
                __assert_fail("bitmap_equal_p (live, bb->in)",
                              "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                              ,0x2017,"void rewrite(gen_ctx_t)");
              }
              pMStack_b0 = (MIR_insn_t)0x0;
              p = (size_t)pVVar34;
              while (iVar55 = bitmap_iterator_next((bitmap_iterator_t *)&p,&nel), iVar55 != 0) {
                if (nel < 0x22) {
                  __assert_fail("nel > ST1_HARD_REG",
                                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                                ,0x2019,"void rewrite(gen_ctx_t)");
                }
                MVar25 = (MIR_reg_t)nel;
                iVar55 = bitmap_bit_p(pbVar48->kill,nel & 0xffffffff);
                if (iVar55 == 0) {
                  __assert_fail("bitmap_bit_p (bb->kill, reg)",
                                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                                ,0x201b,"void rewrite(gen_ctx_t)");
                }
                pMVar46 = ((pbVar48->bb_insns).head)->insn;
                spill_restore_reg(gen_ctx,MVar25,MVar23,pMVar46,
                                  (uint)(*(int *)&pMVar46->field_0x18 == 0xb4),0);
              }
              pDVar60 = (DLIST_bb_t *)&(pbVar48->bb_link).next;
            }
            goto LAB_001350f6;
          }
          __ptr_01 = pVVar62->varr;
          if (__ptr_01 != (spill_cache_el_t *)0x0) goto code_r0x00134f72;
          pcVar68 = "expand";
        }
        goto LAB_00136544;
      }
      lVar59 = 0;
      lVar74 = 0;
      lVar75 = 0;
      pMVar46 = (((gen_ctx->curr_func_item->u).func)->insns).head;
      while( true ) {
        auVar79 = in_ZMM2._0_16_;
        auVar78 = in_ZMM0._0_16_;
        if (pMVar46 == (MIR_insn_t)0x0) break;
        pMVar11 = (pMVar46->insn_link).next;
        lVar74 = lVar74 + (ulong)((*(ulong *)&pMVar46->field_0x18 & 0xfffffffc) == 0);
        uVar50 = rewrite_insn(gen_ctx,pMVar46,MVar23,(rewrite_data *)0x0);
        lVar59 = lVar59 + (ulong)uVar50;
        lVar75 = lVar75 + 1;
        pMVar46 = pMVar11;
      }
LAB_001350f6:
      if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (0 < gen_ctx->debug_level)) {
        auVar78 = vcvtusi2sd_avx512f(auVar78,lVar59);
        dVar15 = auVar78._0_8_ * 100.0;
        auVar78 = vcvtusi2sd_avx512f(auVar79,lVar74);
        auVar79 = vcvtusi2sd_avx512f(auVar79,lVar75);
        fprintf((FILE *)gen_ctx->debug_file,
                "%5lu deleted RA noop moves out of %lu all moves (%.1f%%), out of %lu all insns (%.1f%%)\n"
                ,dVar15 / auVar78._0_8_,dVar15 / auVar79._0_8_,lVar59,lVar74);
      }
      if (pVVar41 != (bitmap_t)0x0) {
        bitmap_and_compl(gen_ctx->func_used_hard_regs,gen_ctx->func_used_hard_regs,pVVar41);
      }
      if (1 < uVar26) {
        if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
          fwrite("+++++++++++++Spill info:\n",0x19,1,(FILE *)gen_ctx->debug_file);
          print_CFG(gen_ctx,1,0,0,0,output_bb_spill_info);
        }
        uVar3 = gen_ctx->target_ctx->keep_fp_p;
        VARR_spill_el_ttrunc(gen_ctx->ra_ctx->spill_els,0);
        pbVar42 = DLIST_bb_t_el(&gen_ctx->curr_cfg->bbs,2);
        pgVar66 = gen_ctx;
        for (; pbVar42 != (bb_t_conflict)0x0; pbVar42 = (pbVar42->bb_link).next) {
          if ((pbVar42->bb_insns).head == (bb_insn_t)0x0) {
            __assert_fail("(DLIST_bb_insn_t_head (&(bb->bb_insns))) != ((void*)0)",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                          ,0x2041,"void collect_spill_els(gen_ctx_t)");
          }
          pFVar53 = (FILE *)gen_ctx->debug_file;
          if ((pFVar53 != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
            sVar27 = pbVar42->index;
            uVar26 = bb_loop_level(pbVar42);
            fprintf(pFVar53," Process BB%lu(level %d) for splitting\n",sVar27,(ulong)uVar26);
          }
          pgVar66 = (gen_ctx_t)((ulong)pgVar66 & 0xff0000ffffffffff | 0x1010000000000);
          paVar64 = (anon_union_8_2_0ec0d2a8_for_u *)&(pbVar42->out_edges).tail;
          while (aVar12 = (anon_union_8_2_0ec0d2a8_for_u)paVar64->e, aVar12.e != (out_edge_t)0x0) {
            bitmap_and_compl(gen_ctx->temp_bitmap,(aVar12.e)->dst->gen,pbVar42->gen);
            iVar55 = bitmap_empty_p(gen_ctx->temp_bitmap);
            if (iVar55 == 0) {
              local_e8 = (undefined1  [8])gen_ctx->temp_bitmap;
              plStack_e0 = (live_range_t_conflict)0x0;
              while (iVar55 = bitmap_iterator_next((bitmap_iterator_t *)local_e8,&p), iVar55 != 0) {
                if (p < 0x22) {
                  __assert_fail("nel > ST1_HARD_REG",
                                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                                ,0x204d,"void collect_spill_els(gen_ctx_t)");
                }
                pgVar66 = (gen_ctx_t)
                          ((ulong)pgVar66 & 0xffffff0000000000 | p & 0xffffffff | 0x100000000);
                obj_02.u.e = aVar12.e;
                obj_02._0_8_ = pgVar66;
                VARR_spill_el_tpush(gen_ctx->ra_ctx->spill_els,obj_02);
              }
            }
            paVar64 = (anon_union_8_2_0ec0d2a8_for_u *)&(aVar12.e)->out_link;
          }
          paVar64 = (anon_union_8_2_0ec0d2a8_for_u *)&(pbVar42->in_edges).tail;
          while (aVar12 = (anon_union_8_2_0ec0d2a8_for_u)paVar64->e,
                aVar12.e != (in_edge_t_conflict)0x0) {
            bitmap_clear(gen_ctx->temp_bitmap);
            local_e8 = (undefined1  [8])(aVar12.e)->src->gen;
            plStack_e0 = (live_range_t_conflict)0x0;
            while (iVar55 = bitmap_iterator_next((bitmap_iterator_t *)local_e8,&p), sVar27 = p,
                  iVar55 != 0) {
              iVar55 = bitmap_bit_p(pbVar42->gen,p);
              if ((iVar55 == 0) && (iVar55 = bitmap_bit_p(pbVar42->in,sVar27), iVar55 != 0)) {
                bitmap_set_bit_p(gen_ctx->temp_bitmap,sVar27);
              }
            }
            iVar55 = bitmap_empty_p(gen_ctx->temp_bitmap);
            if (iVar55 == 0) {
              local_e8 = (undefined1  [8])gen_ctx->temp_bitmap;
              plStack_e0 = (live_range_t_conflict)0x0;
              while (iVar55 = bitmap_iterator_next((bitmap_iterator_t *)local_e8,&p), iVar55 != 0) {
                if (p < 0x22) {
                  __assert_fail("nel > ST1_HARD_REG",
                                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                                ,0x205d,"void collect_spill_els(gen_ctx_t)");
                }
                pgVar66 = (gen_ctx_t)((ulong)pgVar66 & 0xffffff0000000000 | p & 0xffffffff);
                obj_03.u.e = aVar12.e;
                obj_03._0_8_ = pgVar66;
                VARR_spill_el_tpush(gen_ctx->ra_ctx->spill_els,obj_03);
              }
            }
            paVar64 = (anon_union_8_2_0ec0d2a8_for_u *)&(aVar12.e)->in_link;
          }
        }
        psVar43 = VARR_spill_el_taddr(gen_ctx->ra_ctx->spill_els);
        sVar27 = VARR_spill_el_tlength(gen_ctx->ra_ctx->spill_els);
        qsort(psVar43,sVar27,0x10,spill_el_sort_cmp);
        if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
          fwrite(" Spills on edges:\n",0x12,1,(FILE *)gen_ctx->debug_file);
          paVar64 = &psVar43->u;
          for (uVar61 = 0; sVar27 = VARR_spill_el_tlength(gen_ctx->ra_ctx->spill_els),
              uVar61 < sVar27; uVar61 = uVar61 + 1) {
            if (*(char *)((long)paVar64 + -3) == '\0') {
              __assert_fail("spill_els_addr[i].edge_p",
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                            ,0x20f1,"void split(gen_ctx_t)");
            }
            pcVar68 = "spill";
            pcVar39 = "end";
            if (*(char *)((long)paVar64 + -4) == '\0') {
              pcVar68 = "restore";
            }
            if (*(char *)((long)paVar64 + -2) == '\0') {
              pcVar39 = "start";
            }
            fprintf((FILE *)gen_ctx->debug_file,"  %s r%d on %s of edge bb%lu->bb%lu\n",pcVar68,
                    (ulong)((spill_el_t *)(paVar64 + -1))->reg,pcVar39,paVar64->e->src->index,
                    paVar64->e->dst->index);
            paVar64 = paVar64 + 2;
          }
        }
        pVVar41 = gen_ctx->temp_bitmap;
        psVar44 = VARR_spill_el_taddr(gen_ctx->ra_ctx->spill_els);
        sVar27 = VARR_spill_el_tlength(gen_ctx->ra_ctx->spill_els);
        if (sVar27 != 0) {
          for (pbVar42 = DLIST_bb_t_el(&gen_ctx->curr_cfg->bbs,2); pbVar42 != (bb_t_conflict)0x0;
              pbVar42 = (pbVar42->bb_link).next) {
            bitmap_clear(pbVar42->kill);
            bitmap_clear(pbVar42->gen);
            pDVar45 = &pbVar42->out_edges;
            while (peVar73 = pDVar45->head, peVar73 != (out_edge_t)0x0) {
              peVar73->flag1 = '\0';
              peVar73->flag2 = '\0';
              pDVar45 = (DLIST_out_edge_t *)&(peVar73->out_link).next;
            }
          }
          psVar69 = psVar44;
          for (uVar61 = 0; sVar27 = VARR_spill_el_tlength(gen_ctx->ra_ctx->spill_els),
              uVar61 < sVar27; uVar61 = uVar61 + 1) {
            if (psVar69->edge_p == '\0') {
              __assert_fail("spill_els_addr[i].edge_p",
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                            ,0x209a,"void transform_edge_to_bb_placement(gen_ctx_t)");
            }
            peVar13 = (psVar69->u).e;
            bVar76 = true;
            if ((psVar69->spill_p == '\0') &&
               (((iVar55 = (int)*(undefined8 *)&((peVar13->src->bb_insns).tail)->insn->field_0x18,
                 0xffffffd0 < iVar55 - 0xa5U || (iVar55 == 0xaa)) || (iVar55 == 0xa6)))) {
              bVar76 = iVar55 == 0x76;
            }
            peVar13->flag1 = bVar76;
            peVar13->flag2 = '\x01';
            bitmap_set_bit_p(peVar13->src->kill,(ulong)psVar69->reg);
            bitmap_set_bit_p(peVar13->dst->gen,(ulong)psVar69->reg);
            psVar69 = psVar69 + 1;
          }
          uVar61 = 0;
          while (sVar27 = VARR_spill_el_tlength(gen_ctx->ra_ctx->spill_els), uVar61 < sVar27) {
            peVar13 = psVar44[uVar61].u.e;
            bitmap_clear(pVVar41);
            for (paVar64 = &psVar44[uVar61].u;
                (sVar27 = VARR_spill_el_tlength(gen_ctx->ra_ctx->spill_els), uVar61 < sVar27 &&
                (peVar13 == paVar64->e)); paVar64 = paVar64 + 2) {
              bitmap_set_bit_p(pVVar41,(ulong)((spill_el_t *)(paVar64 + -1))->reg);
              uVar61 = uVar61 + 1;
            }
            if (peVar13->flag1 != '\0') {
              peVar73 = (peVar13->src->out_edges).head;
              for (peVar51 = peVar73; peVar51 != (out_edge_t)0x0; peVar51 = (peVar51->out_link).next
                  ) {
                if (peVar51->flag1 == '\0') goto LAB_00135772;
              }
              iVar55 = bitmap_equal_p(pVVar41,peVar13->src->kill);
              if (iVar55 == 0) {
LAB_00135772:
                for (; peVar73 != (out_edge_t)0x0; peVar73 = (peVar73->out_link).next) {
                  peVar73->flag1 = '\0';
                }
              }
            }
            if (peVar13->flag2 != '\0') {
              peVar70 = (peVar13->dst->in_edges).head;
              for (peVar52 = peVar70; peVar52 != (in_edge_t_conflict)0x0;
                  peVar52 = (peVar52->in_link).next) {
                if (peVar52->flag2 == '\0') goto LAB_001357c1;
              }
              iVar55 = bitmap_equal_p(pVVar41,peVar13->dst->gen);
              if (iVar55 == 0) {
LAB_001357c1:
                for (; peVar70 != (in_edge_t_conflict)0x0; peVar70 = (peVar70->in_link).next) {
                  peVar70->flag2 = '\0';
                }
              }
            }
          }
          paVar64 = &psVar44->u;
          for (uVar61 = 0; sVar27 = VARR_spill_el_tlength(gen_ctx->ra_ctx->spill_els),
              uVar61 < sVar27; uVar61 = uVar61 + 1) {
            peVar13 = paVar64->e;
            if ((peVar13->flag1 != '\0') && (peVar13->flag2 != '\0')) {
              if ((peVar13->src->out_edges).head == (peVar13->src->out_edges).tail) {
                peVar13->flag1 = '\0';
              }
              else if ((peVar13->dst->in_edges).head == (peVar13->dst->in_edges).tail) {
                peVar13->flag2 = '\0';
              }
            }
            paVar64 = paVar64 + 2;
          }
          uVar26 = gen_ctx->curr_bb_index;
          for (uVar61 = 0; sVar27 = VARR_spill_el_tlength(gen_ctx->ra_ctx->spill_els),
              uVar61 < sVar27; uVar61 = uVar61 + 1) {
            if (psVar44[uVar61].edge_p == '\0') {
              __assert_fail("spill_els_addr[n].edge_p",
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                            ,0x20c3,"void transform_edge_to_bb_placement(gen_ctx_t)");
            }
            peVar70 = psVar44[uVar61].u.e;
            psVar44[uVar61].edge_p = '\0';
            psVar44[uVar61].bb_end_p = '\0';
            if (peVar70->flag1 == '\0') {
              if (peVar70->flag2 == '\0') {
                pbVar48 = peVar70->src;
                if (pbVar48->index < (ulong)uVar26) {
                  pbVar28 = peVar70->dst;
                  if (pbVar28->index < (ulong)uVar26) {
                    bb_insn_00 = (pbVar48->bb_insns).tail;
                    bb_insn = (pbVar28->bb_insns).head;
                    after = bb_insn_00->insn;
                    pMVar14 = gen_ctx->ctx;
                    pMVar46 = bb_insn->insn;
                    if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (3 < gen_ctx->debug_level))
                    {
                      fprintf((FILE *)gen_ctx->debug_file,"    Splitting bb%lu->bb%lu:\n");
                    }
                    if ((pbVar48->out_edges).head == (pbVar48->out_edges).tail) {
                      if (peVar70->fall_through_p != '\0') goto LAB_00135a3b;
                      pbVar49 = pbVar48;
                      if ((pbVar48->in_edges).head == (pbVar48->in_edges).tail) goto LAB_00135b5e;
                      uVar50 = *(int *)&after->field_0x18 - 0x76;
                      if ((0x36 < uVar50) ||
                         ((0x60000000000001U >> ((ulong)uVar50 & 0x3f) & 1) == 0)) {
                        __assert_fail("last_insn->code == MIR_JMP || last_insn->code == MIR_RET || last_insn->code == MIR_JRET"
                                      ,
                                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                                      ,0x392,"bb_t split_edge_if_necessary(gen_ctx_t, edge_t)");
                      }
                      delete_bb_insn(gen_ctx,bb_insn_00);
                      pMVar46 = after;
LAB_00135a6d:
                      pbVar49 = create_bb(gen_ctx,pMVar46);
                      insert_new_bb_after(gen_ctx,pbVar48,pbVar49);
                      DLIST_in_edge_t_remove(&pbVar28->in_edges,peVar70);
                      peVar70->dst = pbVar49;
                      DLIST_in_edge_t_append(&pbVar49->in_edges,peVar70);
                      create_edge(gen_ctx,pbVar49,pbVar28,(uint)peVar70->fall_through_p,1);
                      peVar70->fall_through_p = '\x01';
                      if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (3 < gen_ctx->debug_level)
                         ) {
                        fprintf((FILE *)gen_ctx->debug_file,
                                "     creating fall through bb%lu after bb%lu, redirect the edge to it"
                                ,pbVar49->index,pbVar48->index);
                        fprintf((FILE *)gen_ctx->debug_file,", and create edge bb%lu->bb%lu:\n",
                                pbVar49->index,pbVar28->index);
                        fwrite("       new bb insn is ",0x16,1,(FILE *)gen_ctx->debug_file);
LAB_00135b45:
                        bb_insn_00 = (bb_insn_t_conflict)pMVar46->data;
LAB_00135b48:
                        print_bb_insn(gen_ctx,bb_insn_00,0);
                      }
                    }
                    else {
                      if (peVar70->fall_through_p != '\0') {
LAB_00135a3b:
                        pMVar46 = MIR_new_insn_arr(pMVar14,MIR_USE,0,(MIR_op_t *)0x0);
                        MIR_insert_insn_after(pMVar14,gen_ctx->curr_func_item,after,pMVar46);
                        goto LAB_00135a6d;
                      }
                      elem = (pbVar28->in_edges).head;
                      if (elem != (pbVar28->in_edges).tail) {
                        if (*(int *)&pMVar46->field_0x18 != 0xb4) {
                          __assert_fail("first_insn->code == MIR_LABEL",
                                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                                        ,0x3b9,"bb_t split_edge_if_necessary(gen_ctx_t, edge_t)");
                        }
                        for (; elem != (in_edge_t_conflict)0x0; elem = (elem->in_link).next) {
                          if (elem->fall_through_p != '\0') {
                            if (elem->dst != pbVar28) {
                              __assert_fail("e2->dst == dst",
                                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                                            ,0x3c0,"bb_t split_edge_if_necessary(gen_ctx_t, edge_t)"
                                           );
                            }
                            MIR_new_label_op(pMVar14,pMVar46);
                            auVar81 = local_e8;
                            plVar40 = plStack_e0;
                            pVVar41 = pVStack_d8;
                            plVar30 = plStack_d0;
                            uVar82 = uStack_c8;
                            uVar83 = uStack_c0;
                            pMVar47 = MIR_new_insn(pMVar14,MIR_JMP);
                            pMVar11 = ((elem->src->bb_insns).tail)->insn;
                            if (((elem->out_link).next == (out_edge_t)0x0) &&
                               ((elem->out_link).prev == (out_edge_t)0x0)) {
                              iVar55 = (int)*(undefined8 *)&pMVar11->field_0x18;
                              if (((0xffffffd0 < iVar55 - 0xa5U) || (iVar55 == 0xaa)) ||
                                 (iVar55 == 0xa6)) {
                                __assert_fail("!MIR_any_branch_code_p (tail_insn->code)",
                                              "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                                              ,0x3c5,
                                              "bb_t split_edge_if_necessary(gen_ctx_t, edge_t)");
                              }
                              gen_add_insn_after(gen_ctx,pMVar11,pMVar47);
                              elem->fall_through_p = '\0';
                              if (((FILE *)gen_ctx->debug_file == (FILE *)0x0) ||
                                 (gen_ctx->debug_level < 4)) break;
                              sVar27 = elem->src->index;
                              fprintf((FILE *)gen_ctx->debug_file,
                                      "     Make edge bb%lu->bb%lu a non-fall through, add new insn at the of bb%lu "
                                      ,sVar27,elem->dst->index,sVar27,pMVar14,auVar81,plVar40,
                                      pVVar41,plVar30,uVar82,uVar83);
                            }
                            else {
                              MIR_insert_insn_after(pMVar14,gen_ctx->curr_func_item,pMVar11,pMVar47)
                              ;
                              pbVar48 = create_bb(gen_ctx,pMVar47);
                              insert_new_bb_after(gen_ctx,elem->src,pbVar48);
                              DLIST_in_edge_t_remove(&elem->dst->in_edges,elem);
                              elem->dst = pbVar48;
                              DLIST_in_edge_t_append(&pbVar48->in_edges,elem);
                              create_edge(gen_ctx,pbVar48,pbVar28,0,1);
                              if (((FILE *)gen_ctx->debug_file == (FILE *)0x0) ||
                                 (gen_ctx->debug_level < 4)) break;
                              sVar27 = elem->src->index;
                              fprintf((FILE *)gen_ctx->debug_file,
                                      "     creating bb%lu after bb%lu, redirect edge bb%lu->bb%lu to bb%lu"
                                      ,pbVar48->index,sVar27,sVar27,pbVar28->index,pbVar48->index);
                              fprintf((FILE *)gen_ctx->debug_file,
                                      ", and create jump edge bb%lu->bb%lu:\n",pbVar48->index,
                                      pbVar28->index);
                              fwrite("       new bb insn is ",0x16,1,(FILE *)gen_ctx->debug_file);
                            }
                            print_bb_insn(gen_ctx,(bb_insn_t_conflict)pMVar47->data,0);
                            break;
                          }
                          pbVar63 = (elem->src->bb_insns).tail;
                          if ((pbVar63 == (bb_insn_t)0x0) ||
                             (((iVar55 = (int)*(undefined8 *)&pbVar63->insn->field_0x18,
                               iVar55 - 0xa5U < 0xffffffd1 && (iVar55 != 0xa6)) && (iVar55 != 0xaa))
                             )) {
                            __assert_fail("(DLIST_bb_insn_t_tail (&(e2->src->bb_insns))) != ((void*)0) && MIR_any_branch_code_p ((DLIST_bb_insn_t_tail (&(e2->src->bb_insns)))->insn->code)"
                                          ,
                                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                                          ,0x3bd,"bb_t split_edge_if_necessary(gen_ctx_t, edge_t)");
                          }
                        }
                        pMVar47 = MIR_new_label(pMVar14);
                        MIR_insert_insn_before(pMVar14,gen_ctx->curr_func_item,pMVar46,pMVar47);
                        pbVar49 = create_bb(gen_ctx,pMVar47);
                        insert_new_bb_before(gen_ctx,pbVar28,pbVar49);
                        DLIST_in_edge_t_remove(&pbVar28->in_edges,peVar70);
                        peVar70->dst = pbVar49;
                        DLIST_in_edge_t_append(&pbVar49->in_edges,peVar70);
                        create_edge(gen_ctx,pbVar49,pbVar28,1,1);
                        if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) &&
                           (3 < gen_ctx->debug_level)) {
                          fprintf((FILE *)gen_ctx->debug_file,
                                  "     creating bb%lu before bb%lu, redirect the edge to it",
                                  pbVar49->index,pbVar28->index);
                          fprintf((FILE *)gen_ctx->debug_file,
                                  ", and create fall-through edge bb%lu->bb%lu:\n",pbVar49->index,
                                  pbVar28->index);
                          fwrite("       new bb insn is ",0x16,1,(FILE *)gen_ctx->debug_file);
                          print_bb_insn(gen_ctx,(bb_insn_t_conflict)pMVar47->data,0);
                          fwrite("       change src bb insn ",0x1a,1,(FILE *)gen_ctx->debug_file);
                          print_bb_insn(gen_ctx,bb_insn_00,0);
                        }
                        if ((int)*(ulong *)&after->field_0x18 == 0xaa) {
                          ppMVar54 = &after[1].insn_link.next;
                          uVar65 = 1;
                          while( true ) {
                            if (*(ulong *)&after->field_0x18 >> 0x20 <= uVar65) {
                              __assert_fail("i < last_insn->nops",
                                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                                            ,0x3ff,"bb_t split_edge_if_necessary(gen_ctx_t, edge_t)"
                                           );
                            }
                            if (*ppMVar54 == pMVar46) break;
                            uVar65 = uVar65 + 1;
                            ppMVar54 = ppMVar54 + 6;
                          }
                          MIR_new_label_op(pMVar14,pMVar47);
                          *ppMVar54 = pMStack_a8;
                          ppMVar54[1] = (MIR_insn_t)plStack_a0;
                          ppMVar54[2] = (MIR_insn_t)uStack_98;
                          ppMVar54[3] = (MIR_insn_t)MStack_90;
                          ppMVar54[-2] = (MIR_insn_t)p;
                          ((DLIST_LINK_MIR_insn_t *)(ppMVar54 + -1))->prev = pMStack_b0;
                          *ppMVar54 = pMStack_a8;
                          ppMVar54[1] = (MIR_insn_t)plStack_a0;
                        }
                        else {
                          if ((after->ops[0].field_0x8 != '\f') ||
                             ((MIR_insn_t)after->ops[0].u.i != pMVar46)) {
                            __assert_fail("last_insn->ops[0].mode == MIR_OP_LABEL && last_insn->ops[0].u.label == first_insn"
                                          ,
                                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                                          ,0x3fa,"bb_t split_edge_if_necessary(gen_ctx_t, edge_t)");
                          }
                          MIR_new_label_op(pMVar14,pMVar47);
                          after->ops[0].u.i = (int64_t)pMStack_a8;
                          after->ops[0].u.str.s = (char *)plStack_a0;
                          *(undefined8 *)((long)&after->ops[0].u + 0x10) = uStack_98;
                          after->ops[0].u.mem.disp = MStack_90;
                          after->ops[0].data = (void *)p;
                          *(MIR_insn_t *)&after->ops[0].field_0x8 = pMStack_b0;
                          after->ops[0].u.i = (int64_t)pMStack_a8;
                          after->ops[0].u.str.s = (char *)plStack_a0;
                        }
                        if (((FILE *)gen_ctx->debug_file == (FILE *)0x0) ||
                           (gen_ctx->debug_level < 4)) goto LAB_00135b5e;
                        fwrite("         to insn ",0x11,1,(FILE *)gen_ctx->debug_file);
                        goto LAB_00135b48;
                      }
                      if (*(int *)&pMVar46->field_0x18 != 0xb4) {
                        __assert_fail("first_insn->code == MIR_LABEL",
                                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                                      ,0x3a6,"bb_t split_edge_if_necessary(gen_ctx_t, edge_t)");
                      }
                      pbVar49 = pbVar28;
                      if (bb_insn != (pbVar28->bb_insns).tail) {
                        delete_bb_insn(gen_ctx,bb_insn);
                        pbVar49 = create_bb(gen_ctx,pMVar46);
                        insert_new_bb_before(gen_ctx,pbVar28,pbVar49);
                        DLIST_in_edge_t_remove(&pbVar28->in_edges,peVar70);
                        peVar70->dst = pbVar49;
                        DLIST_in_edge_t_append(&pbVar49->in_edges,peVar70);
                        create_edge(gen_ctx,pbVar49,pbVar28,1,1);
                        if (((FILE *)gen_ctx->debug_file == (FILE *)0x0) ||
                           (gen_ctx->debug_level < 4)) goto LAB_00135b5e;
                        fprintf((FILE *)gen_ctx->debug_file,
                                "     creating bb%lu before bb%lu, redirect the edge to it",
                                pbVar49->index,pbVar28->index);
                        fprintf((FILE *)gen_ctx->debug_file,
                                ", and create fall-through edge bb%lu->bb%lu:\n",pbVar49->index,
                                pbVar28->index);
                        fwrite("       new bb insn is ",0x16,1,(FILE *)gen_ctx->debug_file);
                        goto LAB_00135b45;
                      }
                    }
LAB_00135b5e:
                    psVar44[uVar61].u.bb = pbVar49;
                  }
                  else {
                    sVar27 = DLIST_out_edge_t_length(&pbVar28->out_edges);
                    if ((sVar27 != 1) ||
                       (sVar27 = DLIST_in_edge_t_length(&pbVar28->in_edges), sVar27 != 1)) {
                      __assert_fail("(DLIST_out_edge_t_length (&(e->dst->out_edges))) == 1 && (DLIST_in_edge_t_length (&(e->dst->in_edges))) == 1"
                                    ,
                                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                                    ,0x20d2,"void transform_edge_to_bb_placement(gen_ctx_t)");
                    }
                    psVar44[uVar61].u.bb = pbVar28;
                  }
                }
                else {
                  sVar27 = DLIST_out_edge_t_length(&pbVar48->out_edges);
                  if ((sVar27 != 1) ||
                     (sVar27 = DLIST_in_edge_t_length(&pbVar48->in_edges), sVar27 != 1)) {
                    __assert_fail("(DLIST_out_edge_t_length (&(e->src->out_edges))) == 1 && (DLIST_in_edge_t_length (&(e->src->in_edges))) == 1"
                                  ,
                                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                                  ,0x20ce,"void transform_edge_to_bb_placement(gen_ctx_t)");
                  }
                  psVar44[uVar61].u.bb = pbVar48;
                }
              }
              else {
                psVar44[uVar61].u = (anon_union_8_2_0ec0d2a8_for_u)peVar70->dst;
              }
            }
            else {
              psVar44[uVar61].u.bb = peVar70->src;
              psVar44[uVar61].bb_end_p = '\x01';
            }
          }
        }
        sVar27 = VARR_spill_el_tlength(gen_ctx->ra_ctx->spill_els);
        qsort(psVar43,sVar27,0x10,spill_el_sort_cmp);
        sVar27 = VARR_spill_el_tlength(gen_ctx->ra_ctx->spill_els);
        psVar43 = VARR_spill_el_taddr(gen_ctx->ra_ctx->spill_els);
        if (sVar27 != 0) {
          lVar59 = 0;
          psVar44 = psVar43;
          while( true ) {
            psVar69 = psVar44;
            sVar27 = sVar27 - 1;
            psVar44 = psVar69 + 1;
            if (sVar27 == 0) break;
            iVar55 = spill_el_cmp(psVar43 + lVar59,psVar44);
            if (iVar55 != 0) {
              cVar16 = psVar44->spill_p;
              cVar17 = psVar44->edge_p;
              cVar18 = psVar44->bb_end_p;
              uVar19 = psVar44->field_0x7;
              aVar12 = psVar69[1].u;
              lVar59 = lVar59 + 1;
              psVar69 = psVar43 + lVar59;
              psVar69->reg = psVar44->reg;
              psVar69->spill_p = cVar16;
              psVar69->edge_p = cVar17;
              psVar69->bb_end_p = cVar18;
              psVar69->field_0x7 = uVar19;
              psVar69->u = aVar12;
            }
          }
          VARR_spill_el_ttrunc(gen_ctx->ra_ctx->spill_els,lVar59 + 1);
        }
        psVar43 = VARR_spill_el_taddr(gen_ctx->ra_ctx->spill_els);
        if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
          fwrite("+++++++++++++MIR after splitting edges:\n",0x28,1,(FILE *)gen_ctx->debug_file);
          print_CFG(gen_ctx,1,0,1,0,(_func_void_gen_ctx_t_bb_t *)0x0);
          fwrite("  Spills on BBs:\n",0x11,1,(FILE *)gen_ctx->debug_file);
          paVar64 = &psVar43->u;
          for (uVar61 = 0; sVar27 = VARR_spill_el_tlength(gen_ctx->ra_ctx->spill_els),
              uVar61 < sVar27; uVar61 = uVar61 + 1) {
            if (*(char *)((long)paVar64 + -3) != '\0') {
              __assert_fail("!spill_els_addr[i].edge_p",
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                            ,0x2103,"void split(gen_ctx_t)");
            }
            pcVar68 = "spill";
            pcVar39 = "end";
            if (*(char *)((long)paVar64 + -4) == '\0') {
              pcVar68 = "restore";
            }
            if (*(char *)((long)paVar64 + -2) == '\0') {
              pcVar39 = "start";
            }
            fprintf((FILE *)gen_ctx->debug_file,"    %s r%d on %s of bb%lu\n",pcVar68,
                    (ulong)((spill_el_t *)(paVar64 + -1))->reg,pcVar39,paVar64->e->src);
            paVar64 = paVar64 + 2;
          }
        }
        paVar64 = &psVar43->u;
        for (uVar61 = 0; sVar27 = VARR_spill_el_tlength(gen_ctx->ra_ctx->spill_els), uVar61 < sVar27
            ; uVar61 = uVar61 + 1) {
          if (((spill_el_t *)(paVar64 + -1))->reg < 0x22) {
            __assert_fail("reg > ST1_HARD_REG",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                          ,0x210e,"void split(gen_ctx_t)");
          }
          if (*(char *)((long)paVar64 + -2) == '\0') {
            pMVar46 = ((paVar64->bb->bb_insns).head)->insn;
            bVar76 = *(int *)&pMVar46->field_0x18 == 0xb4;
          }
          else {
            pMVar46 = ((paVar64->bb->bb_insns).tail)->insn;
            bVar76 = (*(int *)&pMVar46->field_0x18 - 0xa6U & 0xfffffffb) != 0 &&
                     *(int *)&pMVar46->field_0x18 - 0xa5U < 0xffffffd1;
          }
          spill_restore_reg(gen_ctx,((spill_el_t *)(paVar64 + -1))->reg,5 - (uVar3 == '\0'),pMVar46,
                            (uint)bVar76,(uint)(*(char *)((long)paVar64 + -4) == '\0'));
          paVar64 = paVar64 + 2;
        }
      }
      uVar61 = 0;
      while( true ) {
        sVar27 = VARR_live_range_tlength(gen_ctx->lr_ctx->var_live_ranges);
        pVVar6 = gen_ctx->lr_ctx->var_live_ranges;
        if (sVar27 <= uVar61) break;
        plVar40 = VARR_live_range_tget(pVVar6,uVar61);
        while (plVar40 != (live_range_t_conflict)0x0) {
          plVar30 = plVar40->next;
          free_one_live_range(gen_ctx,plVar40);
          plVar40 = plVar30;
        }
        uVar61 = uVar61 + 1;
      }
      if ((pVVar6 != (VARR_live_range_t *)0x0) && (pVVar6->varr != (live_range_t_conflict *)0x0)) {
        pVVar6->els_num = 0;
        return;
      }
      pcVar68 = "trunc";
LAB_00136509:
      mir_varr_assert_fail(pcVar68,"live_range_t");
    }
    pcVar68 = "length";
  }
LAB_001365b4:
  mir_varr_assert_fail(pcVar68,"allocno_info_t");
code_r0x00134f72:
  uVar65 = uVar61 + 1;
  if (pVVar62->size <= uVar61) {
    sVar27 = (uVar65 >> 1) + uVar65;
    __ptr_01 = (spill_cache_el_t *)realloc(__ptr_01,sVar27 * 8);
    pVVar62->varr = __ptr_01;
    pVVar62->size = sVar27;
    uVar61 = pVVar62->els_num;
    uVar65 = uVar61 + 1;
  }
  pVVar62->els_num = uVar65;
  __ptr_01[uVar61].age = 0;
  __ptr_01[uVar61].slot = 0;
  pVVar62 = gen_ctx->ra_ctx->spill_cache;
  goto LAB_00134f4a;
}

Assistant:

static void reg_alloc (gen_ctx_t gen_ctx) {
  MIR_reg_t reg, max_var = get_max_var (gen_ctx);
  const int simplified_p = ONLY_SIMPLIFIED_RA || optimize_level < 2;

  build_live_ranges (gen_ctx);
  assign (gen_ctx);
  DEBUG (2, {
    fprintf (debug_file, "+++++++++++++Disposition after assignment:");
    for (reg = MAX_HARD_REG + 1; reg <= max_var; reg++) {
      if ((reg - MAX_HARD_REG + 1) % 8 == 0) fprintf (debug_file, "\n");
      fprintf (debug_file, " %3u=>", reg);
      if (VARR_LENGTH (live_range_t, var_live_ranges) <= reg
          || VARR_GET (live_range_t, var_live_ranges, reg) == NULL)
        fprintf (debug_file, "UA");
      else
        fprintf (debug_file, "%-2u", VARR_GET (MIR_reg_t, reg_renumber, reg));
    }
    fprintf (debug_file, "\n");
  });
  rewrite (gen_ctx); /* After rewrite the BB live info is invalid as it is used for spill info */
  if (!simplified_p) {
    DEBUG (2, {
      fprintf (debug_file, "+++++++++++++Spill info:\n");
      print_CFG (gen_ctx, TRUE, FALSE, FALSE, FALSE, output_bb_spill_info);
    });
    split (gen_ctx);
  }
  free_func_live_ranges (gen_ctx);
}